

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

void __thiscall
testing::
Action<int_(const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char)>
::Action(Action<int_(const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char)>
         *this,ActionInterface<int_(const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char)>
               *impl)

{
  ActionAdapter local_28;
  ActionInterface<int_(const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char)>
  *local_18;
  ActionInterface<int_(const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char)>
  *impl_local;
  Action<int_(const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char)>
  *this_local;
  
  local_18 = impl;
  impl_local = (ActionInterface<int_(const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_unsigned_char)>
                *)this;
  std::
  shared_ptr<testing::ActionInterface<int(std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>const&,unsigned_char)>>
  ::
  shared_ptr<testing::ActionInterface<int(std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>const&,unsigned_char)>,void>
            ((shared_ptr<testing::ActionInterface<int(std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>const&,unsigned_char)>>
              *)&local_28,impl);
  std::
  function<int(std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>const&,unsigned_char)>
  ::
  function<testing::Action<int(std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>const&,unsigned_char)>::ActionAdapter,void>
            ((function<int(std::unique_ptr<SDL_Texture,std::function<void(SDL_Texture*)>>const&,unsigned_char)>
              *)this,&local_28);
  ActionAdapter::~ActionAdapter(&local_28);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}